

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

void __thiscall
DIntermissionScreenCast::Init(DIntermissionScreenCast *this,FIntermissionAction *desc,bool first)

{
  BYTE BVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  PClassActor *pPVar8;
  AActor *pAVar9;
  FCastSound *pFVar10;
  FICastSound *pFVar11;
  FRemapTablePtr *pFVar12;
  FRemapTable *pFVar13;
  FSoundID local_28;
  uint local_24;
  FName local_20;
  uint i;
  FIntermissionAction *pFStack_18;
  bool first_local;
  FIntermissionAction *desc_local;
  DIntermissionScreenCast *this_local;
  
  i._3_1_ = first;
  pFStack_18 = desc;
  desc_local = (FIntermissionAction *)this;
  DIntermissionScreen::Init(&this->super_DIntermissionScreen,desc,first);
  pcVar7 = FString::operator_cast_to_char_((FString *)(pFStack_18 + 1));
  this->mName = pcVar7;
  FName::FName(&local_20,(FName *)&pFStack_18[1].mSize);
  pPVar8 = PClass::FindActor(&local_20);
  this->mClass = pPVar8;
  if (this->mClass == (PClassActor *)0x0) {
    this->mDefaults = (AActor *)0x0;
    this->caststate = (FState *)0x0;
  }
  else {
    pAVar9 = GetDefaultByType(&this->mClass->super_PClass);
    this->mDefaults = pAVar9;
    uVar3 = TArray<FCastSound,_FCastSound>::Size
                      ((TArray<FCastSound,_FCastSound> *)&pFStack_18[1].mClass);
    TArray<FICastSound,_FICastSound>::Resize(&this->mCastSounds,uVar3);
    for (local_24 = 0; uVar3 = local_24,
        uVar4 = TArray<FICastSound,_FICastSound>::Size(&this->mCastSounds), uVar3 < uVar4;
        local_24 = local_24 + 1) {
      pFVar10 = TArray<FCastSound,_FCastSound>::operator[]
                          ((TArray<FCastSound,_FCastSound> *)&pFStack_18[1].mClass,(ulong)local_24);
      BVar1 = pFVar10->mSequence;
      pFVar11 = TArray<FICastSound,_FICastSound>::operator[](&this->mCastSounds,(ulong)local_24);
      pFVar11->mSequence = BVar1;
      pFVar10 = TArray<FCastSound,_FCastSound>::operator[]
                          ((TArray<FCastSound,_FCastSound> *)&pFStack_18[1].mClass,(ulong)local_24);
      BVar1 = pFVar10->mIndex;
      pFVar11 = TArray<FICastSound,_FICastSound>::operator[](&this->mCastSounds,(ulong)local_24);
      pFVar11->mIndex = BVar1;
      pFVar10 = TArray<FCastSound,_FCastSound>::operator[]
                          ((TArray<FCastSound,_FCastSound> *)&pFStack_18[1].mClass,(ulong)local_24);
      pFVar11 = TArray<FICastSound,_FICastSound>::operator[](&this->mCastSounds,(ulong)local_24);
      FSoundID::operator=(&pFVar11->mSound,&pFVar10->mSound);
    }
    this->caststate = this->mDefaults->SeeState;
    bVar2 = PClass::IsDescendantOf
                      (&this->mClass->super_PClass,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar2) {
      this->advplayerstate = this->mDefaults->MissileState;
      pFVar12 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                          (&translationtables[1].super_TArray<FRemapTablePtr,_FRemapTable_*>,
                           (long)consoleplayer);
      pFVar13 = FRemapTablePtr::operator_cast_to_FRemapTable_(pFVar12);
      this->casttranslation = pFVar13;
    }
    else {
      this->advplayerstate = (FState *)0x0;
      this->casttranslation = (FRemapTable *)0x0;
      if (this->mDefaults->Translation != 0) {
        iVar5 = GetTranslationType(this->mDefaults->Translation);
        iVar6 = GetTranslationIndex(this->mDefaults->Translation);
        pFVar12 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                            (&translationtables[iVar5].super_TArray<FRemapTablePtr,_FRemapTable_*>,
                             (long)iVar6);
        pFVar13 = FRemapTablePtr::operator_cast_to_FRemapTable_(pFVar12);
        this->casttranslation = pFVar13;
      }
    }
    this->castdeath = false;
    this->castframes = 0;
    this->castonmelee = 0;
    this->castattacking = false;
    iVar5 = FSoundID::operator_cast_to_int(&(this->mDefaults->SeeSound).super_FSoundID);
    if (iVar5 != 0) {
      FSoundID::FSoundID(&local_28,&(this->mDefaults->SeeSound).super_FSoundID);
      S_Sound(0x22,&local_28,1.0,0.0);
    }
  }
  return;
}

Assistant:

void DIntermissionScreenCast::Init(FIntermissionAction *desc, bool first)
{
	Super::Init(desc, first);
	mName = static_cast<FIntermissionActionCast*>(desc)->mName;
	mClass = PClass::FindActor(static_cast<FIntermissionActionCast*>(desc)->mCastClass);
	if (mClass != NULL) mDefaults = GetDefaultByType(mClass);
	else
	{
		mDefaults = NULL;
		caststate = NULL;
		return;
	}

	mCastSounds.Resize(static_cast<FIntermissionActionCast*>(desc)->mCastSounds.Size());
	for (unsigned i=0; i < mCastSounds.Size(); i++)
	{
		mCastSounds[i].mSequence = static_cast<FIntermissionActionCast*>(desc)->mCastSounds[i].mSequence;
		mCastSounds[i].mIndex = static_cast<FIntermissionActionCast*>(desc)->mCastSounds[i].mIndex;
		mCastSounds[i].mSound = static_cast<FIntermissionActionCast*>(desc)->mCastSounds[i].mSound;
	}
	caststate = mDefaults->SeeState;
	if (mClass->IsDescendantOf(RUNTIME_CLASS(APlayerPawn)))
	{
		advplayerstate = mDefaults->MissileState;
		casttranslation = translationtables[TRANSLATION_Players][consoleplayer];
	}
	else
	{
		advplayerstate = NULL;
		casttranslation = NULL;
		if (mDefaults->Translation != 0)
		{
			casttranslation = translationtables[GetTranslationType(mDefaults->Translation)]
												[GetTranslationIndex(mDefaults->Translation)];
		}
	}
	castdeath = false;
	castframes = 0;
	castonmelee = 0;
	castattacking = false;
	if (mDefaults->SeeSound)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, mDefaults->SeeSound, 1, ATTN_NONE);
	}
}